

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
dynet::Min::forward_dev_impl<dynet::Device_CPU>
          (Min *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ushort uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  int iVar27;
  int iVar28;
  Tensor t;
  type local_d0;
  type local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  ulong uStack_80;
  uint local_78;
  StoragePointerType local_70;
  undefined1 local_68 [16];
  pointer local_58;
  Device *local_50;
  undefined4 local_48;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_min_op<float,_float,_0>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
  local_40;
  
  local_a8.m_data = (StoragePointerType)(this->super_Node).aux_mem;
  local_78 = (fx->d).bd;
  uStack_80 = *(ulong *)((fx->d).d + 6);
  local_98 = *(undefined8 *)(fx->d).d;
  uStack_90 = *(undefined8 *)((fx->d).d + 2);
  uStack_88 = *(undefined8 *)((fx->d).d + 4);
  local_70 = local_a8.m_data;
  local_68 = (undefined1  [16])0x0;
  local_58 = (pointer)0x0;
  local_50 = fx->device;
  local_48 = 0;
  ppTVar1 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = *ppTVar1;
  uVar9 = (ulong)(pTVar2->d).nd;
  iVar28 = 1;
  iVar27 = 1;
  if (uVar9 != 0) {
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar17 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar14,auVar15);
      auVar14 = vporq_avx512f(auVar14,auVar16);
      uVar6 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar18,auVar13,2);
      bVar8 = (byte)uVar6;
      uVar11 = CONCAT11(bVar8,bVar7);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar10));
      auVar18._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar18._0_4_ = (uint)(bVar7 & 1) * auVar14._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar18._32_4_ = (uint)(bVar8 & 1) * auVar14._32_4_;
      auVar18._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar14._36_4_;
      auVar18._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar14._40_4_;
      auVar18._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar14._44_4_;
      auVar18._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar14._48_4_;
      auVar18._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar14._52_4_;
      auVar18._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar14._56_4_;
      auVar18._60_4_ = (uint)(bVar8 >> 7) * auVar14._60_4_;
      auVar14 = vpmulld_avx512f(auVar18,auVar17);
      uVar10 = uVar10 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar10);
    auVar13 = vmovdqa32_avx512f(auVar14);
    auVar14._0_4_ = (uint)(bVar7 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
    bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar14._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar17._4_4_;
    bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar14._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar17._8_4_;
    bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar14._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar17._12_4_;
    bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar14._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar17._16_4_;
    bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar14._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar17._20_4_;
    bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar14._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar17._24_4_;
    bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar14._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar17._28_4_;
    auVar14._32_4_ = (uint)(bVar8 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar17._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar14._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar17._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar14._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar17._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar14._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar17._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar14._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar17._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar14._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar17._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar14._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar17._56_4_;
    auVar14._60_4_ =
         (uint)(bVar8 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar17._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar14,1);
    auVar13 = vpmulld_avx512f(auVar14,ZEXT3264(auVar12));
    auVar4 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar27 = auVar4._0_4_;
  }
  local_d0.m_lhs_xpr.m_data = pTVar2->v;
  local_d0.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar27 * (pTVar2->d).bd;
  local_d0.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  pTVar2 = ppTVar1[1];
  local_d0.m_rhs_xpr.m_data = pTVar2->v;
  uVar9 = (ulong)(pTVar2->d).nd;
  if (uVar9 != 0) {
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar17 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar14,auVar15);
      auVar14 = vporq_avx512f(auVar14,auVar16);
      uVar6 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar18,auVar13,2);
      bVar8 = (byte)uVar6;
      uVar11 = CONCAT11(bVar8,bVar7);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar10));
      auVar19._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar19._0_4_ = (uint)(bVar7 & 1) * auVar14._0_4_;
      auVar19._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar19._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar19._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar19._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar19._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar19._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar19._32_4_ = (uint)(bVar8 & 1) * auVar14._32_4_;
      auVar19._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar14._36_4_;
      auVar19._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar14._40_4_;
      auVar19._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar14._44_4_;
      auVar19._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar14._48_4_;
      auVar19._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar14._52_4_;
      auVar19._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar14._56_4_;
      auVar19._60_4_ = (uint)(bVar8 >> 7) * auVar14._60_4_;
      auVar14 = vpmulld_avx512f(auVar19,auVar17);
      uVar10 = uVar10 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar10);
    auVar13 = vmovdqa32_avx512f(auVar14);
    auVar15._0_4_ = (uint)(bVar7 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
    bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar17._4_4_;
    bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar17._8_4_;
    bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar17._12_4_;
    bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar17._16_4_;
    bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar17._20_4_;
    bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar17._24_4_;
    bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar17._28_4_;
    auVar15._32_4_ = (uint)(bVar8 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar17._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar17._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar17._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar17._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar17._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar17._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar17._56_4_;
    auVar15._60_4_ =
         (uint)(bVar8 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar17._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar15,1);
    auVar13 = vpmulld_avx512f(auVar15,ZEXT3264(auVar12));
    auVar4 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar28 = auVar4._0_4_;
  }
  local_d0.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar28 * (pTVar2->d).bd;
  local_d0.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  uVar9 = uStack_80 >> 0x20;
  if (uVar9 == 0) {
    iVar28 = 1;
  }
  else {
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar17 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar14,auVar15);
      auVar14 = vporq_avx512f(auVar14,auVar16);
      uVar6 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar18,auVar13,2);
      bVar8 = (byte)uVar6;
      uVar11 = CONCAT11(bVar8,bVar7);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((long)&local_98 + uVar10 * 4));
      auVar20._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar20._0_4_ = (uint)(bVar7 & 1) * auVar14._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar20._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar20._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar20._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar20._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar20._32_4_ = (uint)(bVar8 & 1) * auVar14._32_4_;
      auVar20._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar14._36_4_;
      auVar20._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar14._40_4_;
      auVar20._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar14._44_4_;
      auVar20._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar14._48_4_;
      auVar20._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar14._52_4_;
      auVar20._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar14._56_4_;
      auVar20._60_4_ = (uint)(bVar8 >> 7) * auVar14._60_4_;
      auVar14 = vpmulld_avx512f(auVar20,auVar17);
      uVar10 = uVar10 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar10);
    auVar13 = vmovdqa32_avx512f(auVar14);
    auVar16._0_4_ = (uint)(bVar7 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
    bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar17._4_4_;
    bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar17._8_4_;
    bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar17._12_4_;
    bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar16._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar17._16_4_;
    bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar16._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar17._20_4_;
    bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar16._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar17._24_4_;
    bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar16._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar17._28_4_;
    auVar16._32_4_ = (uint)(bVar8 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar17._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar16._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar17._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar16._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar17._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar16._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar17._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar16._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar17._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar16._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar17._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar16._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar17._56_4_;
    auVar16._60_4_ =
         (uint)(bVar8 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar17._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar16,1);
    auVar13 = vpmulld_avx512f(auVar16,ZEXT3264(auVar12));
    auVar4 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar28 = auVar4._0_4_;
  }
  local_a8.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar28 * local_78;
  local_a8.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  local_40.m_lhs_xpr = &local_a8;
  local_40.m_rhs_xpr = &local_d0;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
  ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
         *)&local_40,dev->edevice);
  ppTVar1 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = *ppTVar1;
  uVar9 = (ulong)(pTVar2->d).nd;
  iVar28 = 1;
  iVar27 = 1;
  if (uVar9 != 0) {
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar17 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar14,auVar15);
      auVar14 = vporq_avx512f(auVar14,auVar16);
      uVar6 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar18,auVar13,2);
      bVar8 = (byte)uVar6;
      uVar11 = CONCAT11(bVar8,bVar7);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar10));
      auVar21._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar21._0_4_ = (uint)(bVar7 & 1) * auVar14._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar21._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar21._32_4_ = (uint)(bVar8 & 1) * auVar14._32_4_;
      auVar21._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar14._36_4_;
      auVar21._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar14._40_4_;
      auVar21._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar14._44_4_;
      auVar21._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar14._48_4_;
      auVar21._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar14._52_4_;
      auVar21._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar14._56_4_;
      auVar21._60_4_ = (uint)(bVar8 >> 7) * auVar14._60_4_;
      auVar14 = vpmulld_avx512f(auVar21,auVar17);
      uVar10 = uVar10 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar10);
    auVar13 = vmovdqa32_avx512f(auVar14);
    auVar22._0_4_ = (uint)(bVar7 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
    bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar17._4_4_;
    bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar17._8_4_;
    bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar17._12_4_;
    bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar17._16_4_;
    bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar17._20_4_;
    bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar17._24_4_;
    bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar17._28_4_;
    auVar22._32_4_ = (uint)(bVar8 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar17._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar17._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar17._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar17._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar17._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar17._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar17._56_4_;
    auVar22._60_4_ =
         (uint)(bVar8 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar17._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar22,1);
    auVar13 = vpmulld_avx512f(auVar22,ZEXT3264(auVar12));
    auVar4 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar27 = auVar4._0_4_;
  }
  local_d0.m_lhs_xpr.m_data = pTVar2->v;
  local_d0.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar27 * (pTVar2->d).bd;
  local_d0.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  pTVar2 = ppTVar1[1];
  local_d0.m_rhs_xpr.m_data = pTVar2->v;
  uVar9 = (ulong)(pTVar2->d).nd;
  if (uVar9 != 0) {
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar17 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar14,auVar15);
      auVar14 = vporq_avx512f(auVar14,auVar16);
      uVar6 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar18,auVar13,2);
      bVar8 = (byte)uVar6;
      uVar11 = CONCAT11(bVar8,bVar7);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar10));
      auVar23._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar23._0_4_ = (uint)(bVar7 & 1) * auVar14._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar23._32_4_ = (uint)(bVar8 & 1) * auVar14._32_4_;
      auVar23._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar14._36_4_;
      auVar23._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar14._40_4_;
      auVar23._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar14._44_4_;
      auVar23._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar14._48_4_;
      auVar23._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar14._52_4_;
      auVar23._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar14._56_4_;
      auVar23._60_4_ = (uint)(bVar8 >> 7) * auVar14._60_4_;
      auVar14 = vpmulld_avx512f(auVar23,auVar17);
      uVar10 = uVar10 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar10);
    auVar13 = vmovdqa32_avx512f(auVar14);
    auVar24._0_4_ = (uint)(bVar7 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
    bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar24._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar17._4_4_;
    bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar24._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar17._8_4_;
    bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar24._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar17._12_4_;
    bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar24._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar17._16_4_;
    bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar24._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar17._20_4_;
    bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar24._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar17._24_4_;
    bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar24._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar17._28_4_;
    auVar24._32_4_ = (uint)(bVar8 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar17._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar24._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar17._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar24._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar17._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar24._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar17._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar24._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar17._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar24._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar17._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar24._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar17._56_4_;
    auVar24._60_4_ =
         (uint)(bVar8 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar17._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar24,1);
    auVar13 = vpmulld_avx512f(auVar24,ZEXT3264(auVar12));
    auVar4 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar28 = auVar4._0_4_;
  }
  local_d0.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar28 * (pTVar2->d).bd;
  local_d0.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  local_a8.m_data = fx->v;
  uVar9 = (ulong)(fx->d).nd;
  if (uVar9 == 0) {
    iVar28 = 1;
  }
  else {
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar17 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar14,auVar15);
      auVar14 = vporq_avx512f(auVar14,auVar16);
      uVar6 = vpcmpuq_avx512f(auVar14,auVar13,2);
      bVar7 = (byte)uVar6;
      uVar6 = vpcmpuq_avx512f(auVar18,auVar13,2);
      bVar8 = (byte)uVar6;
      uVar11 = CONCAT11(bVar8,bVar7);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar10));
      auVar25._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar14._4_4_;
      auVar25._0_4_ = (uint)(bVar7 & 1) * auVar14._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar14._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar14._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar14._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar14._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar14._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar14._28_4_;
      auVar25._32_4_ = (uint)(bVar8 & 1) * auVar14._32_4_;
      auVar25._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar14._36_4_;
      auVar25._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar14._40_4_;
      auVar25._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar14._44_4_;
      auVar25._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar14._48_4_;
      auVar25._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar14._52_4_;
      auVar25._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar14._56_4_;
      auVar25._60_4_ = (uint)(bVar8 >> 7) * auVar14._60_4_;
      auVar14 = vpmulld_avx512f(auVar25,auVar17);
      uVar10 = uVar10 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar10);
    auVar13 = vmovdqa32_avx512f(auVar14);
    auVar26._0_4_ = (uint)(bVar7 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar17._0_4_;
    bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
    auVar26._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar17._4_4_;
    bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
    auVar26._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar17._8_4_;
    bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
    auVar26._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar17._12_4_;
    bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
    auVar26._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar17._16_4_;
    bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
    auVar26._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar17._20_4_;
    bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
    auVar26._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar17._24_4_;
    bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
    auVar26._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar17._28_4_;
    auVar26._32_4_ = (uint)(bVar8 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar17._32_4_;
    bVar3 = (bool)(bVar8 >> 1 & 1);
    auVar26._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar17._36_4_;
    bVar3 = (bool)(bVar8 >> 2 & 1);
    auVar26._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar17._40_4_;
    bVar3 = (bool)(bVar8 >> 3 & 1);
    auVar26._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar17._44_4_;
    bVar3 = (bool)(bVar8 >> 4 & 1);
    auVar26._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar17._48_4_;
    bVar3 = (bool)(bVar8 >> 5 & 1);
    auVar26._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar17._52_4_;
    bVar3 = (bool)(bVar8 >> 6 & 1);
    auVar26._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar17._56_4_;
    auVar26._60_4_ =
         (uint)(bVar8 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar17._60_4_;
    auVar12 = vextracti64x4_avx512f(auVar26,1);
    auVar13 = vpmulld_avx512f(auVar26,ZEXT3264(auVar12));
    auVar4 = vpmulld_avx(auVar13._0_16_,auVar13._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    auVar5 = vpshufd_avx(auVar4,0x55);
    auVar4 = vpmulld_avx(auVar4,auVar5);
    iVar28 = auVar4._0_4_;
  }
  local_a8.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar28 * (fx->d).bd;
  local_a8.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  local_40.m_lhs_xpr = &local_a8;
  local_40.m_rhs_xpr = &local_d0;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_min_op<float,_float,_0>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
  ::run(&local_40,dev->edevice);
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector
            ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)local_68);
  return;
}

Assistant:

void Min::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  Tensor t(fx.d, static_cast<float*>(aux_mem), fx.device, DeviceMempool::FXS);
  t.tvec().device(*dev.edevice) = (xs[0]->tvec() < xs[1]->tvec()).cast<float>();
  fx.tvec().device(*dev.edevice) = xs[0]->tvec().cwiseMin(xs[1]->tvec());
}